

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

void __thiscall glslang::TIntermUnary::updatePrecision(TIntermUnary *this)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermUnary *this_local;
  
  iVar2 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x20])();
  if (((iVar2 == 8) ||
      (iVar2 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(), iVar2 == 9)) ||
     (iVar2 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x20])(), iVar2 == 1)) {
    iVar2 = (*(this->operand->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar2) + 8);
    iVar2 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x21])();
    if (((uint)(*(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) >> 0x19) & 7) <
        ((uint)(uVar1 >> 0x19) & 7)) {
      iVar2 = (*(this->operand->super_TIntermNode)._vptr_TIntermNode[0x21])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8);
      iVar2 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x21])();
      *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) =
           *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0xfffffffff1ffffff |
           (ulong)((uint)(uVar1 >> 0x19) & 7) << 0x19;
    }
  }
  return;
}

Assistant:

void TIntermUnary::updatePrecision()
{
    if (getBasicType() == EbtInt || getBasicType() == EbtUint ||
        getBasicType() == EbtFloat) {
        if (operand->getQualifier().precision > getQualifier().precision)
            getQualifier().precision = operand->getQualifier().precision;
    }
}